

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

BCLine lj_debug_frameline(lua_State *L,GCfunc *fn,cTValue *nextframe)

{
  BCPos pc_00;
  cTValue *in_RDX;
  GCfunc *in_RSI;
  lua_State *in_RDI;
  GCproto *pt;
  BCPos pc;
  BCLine local_4;
  
  pc_00 = debug_framepc(in_RDI,in_RSI,in_RDX);
  if (pc_00 == 0xffffffff) {
    local_4 = -1;
  }
  else {
    local_4 = lj_debug_line((GCproto *)((ulong)(in_RSI->c).pc.ptr32 - 0x40),pc_00);
  }
  return local_4;
}

Assistant:

BCLine lj_debug_frameline(lua_State *L, GCfunc *fn, cTValue *nextframe)
{
  BCPos pc = debug_framepc(L, fn, nextframe);
  if (pc != NO_BCPOS) {
    GCproto *pt = funcproto(fn);
    lj_assertL(pc <= pt->sizebc, "PC out of range");
    return lj_debug_line(pt, pc);
  }
  return -1;
}